

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyURIDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AnyURIDatatypeValidator::encode
          (AnyURIDatatypeValidator *this,XMLCh *content,XMLSize_t len,XMLBuffer *encoded,
          MemoryManager *manager)

{
  XMLCh *srcData;
  int iVar1;
  MemoryManager *srcCount;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  char local_a4 [4];
  char tempStr_1 [3];
  ulong uStack_a0;
  XMLByte b;
  XMLSize_t j;
  XMLSize_t utf8Len;
  XMLUTF8Transcoder transcoder;
  XMLSize_t charsEaten;
  XMLByte *UTF8Byte;
  XMLSize_t remContentLen;
  XMLCh *remContent;
  char tempStr [3];
  ulong uStack_38;
  int ch;
  XMLSize_t i;
  MemoryManager *manager_local;
  XMLBuffer *encoded_local;
  XMLSize_t len_local;
  XMLCh *content_local;
  AnyURIDatatypeValidator *this_local;
  XMLByte *toFill;
  
  for (uStack_38 = 0; uStack_38 < len; uStack_38 = uStack_38 + 1) {
    remContent._4_4_ = (uint)(ushort)content[uStack_38];
    if (0x7f < remContent._4_4_) break;
    if ((encode::needEscapeMap[(int)remContent._4_4_] & 1U) == 0) {
      XMLBuffer::append(encoded,content[uStack_38]);
    }
    else {
      memset((void *)((long)&remContent + 1),0,3);
      sprintf((char *)((long)&remContent + 1),"%02X",(ulong)remContent._4_4_);
      XMLBuffer::append(encoded,L'%');
      XMLBuffer::append(encoded,(short)remContent._1_1_);
      XMLBuffer::append(encoded,(short)remContent._2_1_);
    }
  }
  if (uStack_38 < len) {
    srcData = content + uStack_38;
    srcCount = (MemoryManager *)(len - uStack_38);
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,(long)srcCount * 4 + 1);
    toFill = (XMLByte *)CONCAT44(extraout_var,iVar1);
    XMLUTF8Transcoder::XMLUTF8Transcoder
              ((XMLUTF8Transcoder *)&utf8Len,(XMLCh *)XMLUni::fgUTF8EncodingString,
               (long)srcCount * 4 + 1,manager);
    XVar2 = XMLUTF8Transcoder::transcodeTo
                      ((XMLUTF8Transcoder *)&utf8Len,srcData,(XMLSize_t)srcCount,toFill,
                       (long)srcCount * 4,
                       (XMLSize_t *)&transcoder.super_XMLTranscoder.fMemoryManager,UnRep_RepChar);
    if (transcoder.super_XMLTranscoder.fMemoryManager != srcCount) {
      __assert_fail("charsEaten == remContentLen",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AnyURIDatatypeValidator.cpp"
                    ,0xa2,
                    "void xercesc_4_0::AnyURIDatatypeValidator::encode(const XMLCh *const, const XMLSize_t, XMLBuffer &, MemoryManager *const)"
                   );
    }
    for (uStack_a0 = 0; uStack_a0 < XVar2; uStack_a0 = uStack_a0 + 1) {
      local_a4[3] = toFill[uStack_a0];
      if (((byte)local_a4[3] < 0x80) && ((encode::needEscapeMap[(byte)local_a4[3]] & 1U) == 0)) {
        XMLBuffer::append(encoded,(ushort)(byte)local_a4[3]);
      }
      else {
        local_a4[2] = 0;
        local_a4[0] = '\0';
        local_a4[1] = '\0';
        sprintf(local_a4,"%02X",(ulong)(byte)local_a4[3]);
        XMLBuffer::append(encoded,L'%');
        XMLBuffer::append(encoded,(short)local_a4[0]);
        XMLBuffer::append(encoded,(short)local_a4[1]);
      }
    }
    (*manager->_vptr_MemoryManager[4])(manager,toFill);
    XMLUTF8Transcoder::~XMLUTF8Transcoder((XMLUTF8Transcoder *)&utf8Len);
  }
  return;
}

Assistant:

void AnyURIDatatypeValidator::encode(const XMLCh* const content, const XMLSize_t len, XMLBuffer& encoded, MemoryManager* const manager)
{
    static const bool needEscapeMap[] = {
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x00 to 0x0F need escape */
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x10 to 0x1F need escape */
        true , false, true , false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x20:' ', 0x22:'"' */
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x3C:'<', 0x3E:'>' */
        false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, false,
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x5C:'\\', 0x5E:'^' */
        true , false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x60:'`' */
        false, false, false, false, false, false, false, false, false, false, false, true , true , true , true , true   /* 0x7B:'{', 0x7C:'|', 0x7D:'}', 0x7E:'~', 0x7F:DEL */
    };

    // For each character in content
    XMLSize_t i;
    for (i = 0; i < len; i++)
    {
        int ch = (int)content[i];
        // If it's not an ASCII character, break here, and use UTF-8 encoding
        if (ch >= 128)
            break;

        if (needEscapeMap[ch])
        {
            char tempStr[3] = "\0";
            sprintf(tempStr, "%02X", ch);
            encoded.append('%');
            encoded.append((XMLCh)tempStr[0]);
            encoded.append((XMLCh)tempStr[1]);
        }
        else
        {
            encoded.append((XMLCh)ch);
        }
    }

    // we saw some non-ascii character
    if (i < len) {
        // get UTF-8 bytes for the remaining sub-string
        const XMLCh* remContent = (XMLCh*)&content[i];
        const XMLSize_t remContentLen = len - i;
        XMLByte* UTF8Byte = (XMLByte*)manager->allocate((remContentLen*4+1) * sizeof(XMLByte));
        XMLSize_t charsEaten;

        XMLUTF8Transcoder transcoder(XMLUni::fgUTF8EncodingString, remContentLen*4+1, manager);
        XMLSize_t utf8Len = transcoder.transcodeTo(remContent, remContentLen, UTF8Byte, remContentLen*4, charsEaten, XMLTranscoder::UnRep_RepChar);
        assert(charsEaten == remContentLen);

        XMLSize_t j;
        for (j = 0; j < utf8Len; j++) {
            XMLByte b = UTF8Byte[j];
            if (b >= 128 || needEscapeMap[b])
            {
                char tempStr[3] = "\0";
                sprintf(tempStr, "%02X", b);
                encoded.append('%');
                encoded.append((XMLCh)tempStr[0]);
                encoded.append((XMLCh)tempStr[1]);
            }
            else
            {
                encoded.append((XMLCh)b);
            }
        }
        manager->deallocate(UTF8Byte);
    }
}